

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EmitBuffer.cpp
# Opt level: O2

bool __thiscall
EmitBufferManager<Memory::VirtualAllocWrapper,_Memory::PreReservedVirtualAllocWrapper,_CriticalSection>
::CommitBuffer(EmitBufferManager<Memory::VirtualAllocWrapper,_Memory::PreReservedVirtualAllocWrapper,_CriticalSection>
               *this,TEmitBufferAllocation *allocation,size_t destBufferBytes,BYTE *destBuffer,
              size_t bytes,BYTE *sourceBuffer,DWORD alignPad)

{
  char *pcVar1;
  code *pcVar2;
  bool bVar3;
  BOOL BVar4;
  undefined4 *puVar5;
  ulong dwSize;
  BYTE *dst;
  ulong uVar6;
  uint uVar7;
  ulong uVar8;
  ulong sizeInBytes;
  size_t sVar9;
  BYTE *buffer;
  AutoRealOrFakeCriticalSection<CriticalSection> local_90;
  AutoRealOrFakeCriticalSection<CriticalSection> autoCs;
  BYTE *local_80;
  ulong local_70;
  uint local_3c;
  undefined4 *local_38;
  
  local_90.cs = &this->criticalSection;
  CCLock::Enter(&(local_90.cs)->super_CCLock);
  if (destBuffer == (BYTE *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/EmitBuffer.cpp"
                       ,0x1cf,"(destBuffer != nullptr)","destBuffer != nullptr");
    if (!bVar3) goto LAB_003edf96;
    *puVar5 = 0;
  }
  if (allocation == (TEmitBufferAllocation *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/EmitBuffer.cpp"
                       ,0x1d0,"(allocation != nullptr)","allocation != nullptr");
    if (!bVar3) goto LAB_003edf96;
    *puVar5 = 0;
  }
  if (allocation->bytesCommitted != destBufferBytes) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/EmitBuffer.cpp"
                       ,0x1d4,"(destBufferBytes == allocation->bytesCommitted)",
                       "destBufferBytes == allocation->bytesCommitted");
    if (!bVar3) goto LAB_003edf96;
    *puVar5 = 0;
  }
  sVar9 = allocation->bytesUsed;
  dwSize = alignPad + bytes;
  if (destBufferBytes < dwSize + sVar9) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/EmitBuffer.cpp"
                       ,0x1d7,"(allocation->bytesUsed + bytes + alignPad <= destBufferBytes)",
                       "allocation->bytesUsed + bytes + alignPad <= destBufferBytes");
    if (!bVar3) goto LAB_003edf96;
    *puVar5 = 0;
    sVar9 = allocation->bytesUsed;
  }
  pcVar1 = allocation->allocation->address;
  local_3c = alignPad;
  if ((uint)((int)allocation->bytesCommitted - (int)sVar9) < dwSize) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    local_38 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *local_38 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/EmitBuffer.cpp"
                       ,0x1db,"(allocation->BytesFree() >= bytes + alignPad)",
                       "allocation->BytesFree() >= bytes + alignPad");
    if (!bVar3) {
LAB_003edf96:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *local_38 = 0;
  }
  else {
    local_38 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
  }
  autoCs.cs = (CriticalSection *)&this->allocationHeap;
  local_70 = dwSize;
  buffer = destBuffer + sVar9;
  local_80 = sourceBuffer;
  do {
    if (local_70 == 0) {
      BVar4 = FlushInstructionCache(this->processHandle,pcVar1 + sVar9,dwSize);
      if (BVar4 != 0) {
        this->totalBytesCode = this->totalBytesCode + bytes;
        bVar3 = FinalizeAllocation(this,allocation,destBuffer);
        goto LAB_003edf79;
      }
      break;
    }
    if (buffer < destBuffer) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *local_38 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/EmitBuffer.cpp"
                         ,0x1e4,"(destBuffer <= currentDestBuffer)",
                         "destBuffer <= currentDestBuffer");
      if (!bVar3) goto LAB_003edf96;
      *local_38 = 0;
    }
    if (destBuffer + destBufferBytes <= buffer) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *local_38 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/EmitBuffer.cpp"
                         ,0x1e5,"(currentDestBuffer < destBuffer + destBufferBytes)",
                         "currentDestBuffer < destBuffer + destBufferBytes");
      if (!bVar3) goto LAB_003edf96;
      *local_38 = 0;
    }
    uVar7 = 0x1000 - ((uint)buffer & 0xfff);
    uVar6 = (ulong)uVar7;
    if (local_70 < uVar7) {
      uVar6 = local_70;
    }
    bVar3 = CheckCommitFaultInjection(this);
    if (bVar3) break;
    BVar4 = Memory::CustomHeap::
            Heap<Memory::VirtualAllocWrapper,_Memory::PreReservedVirtualAllocWrapper>::
            ProtectAllocationWithExecuteReadWrite
                      ((Heap<Memory::VirtualAllocWrapper,_Memory::PreReservedVirtualAllocWrapper> *)
                       autoCs.cs,allocation->allocation,(char *)buffer);
    bVar3 = false;
    if (BVar4 == 0) goto LAB_003edf79;
    dst = buffer;
    uVar8 = uVar6;
    if (local_3c == 0) {
LAB_003ede3e:
      local_3c = 0;
LAB_003ede45:
      sizeInBytes = (ulong)(uint)((int)allocation->bytesCommitted - (int)allocation->bytesUsed);
      if (destBuffer + destBufferBytes < dst + sizeInBytes) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *local_38 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/EmitBuffer.cpp"
                           ,0x213,
                           "(currentDestBuffer + bufferBytesFree <= destBuffer + destBufferBytes)",
                           "currentDestBuffer + bufferBytesFree <= destBuffer + destBufferBytes");
        if (!bVar3) goto LAB_003edf96;
        *local_38 = 0;
      }
      memcpy_s(dst,sizeInBytes,local_80,uVar8);
      dst = dst + uVar8;
      local_80 = local_80 + uVar8;
      allocation->bytesUsed = allocation->bytesUsed + uVar8;
      local_70 = local_70 - uVar8;
    }
    else {
      if (local_3c < uVar7) {
        uVar7 = local_3c;
      }
      uVar8 = (ulong)uVar7;
      Memory::CustomHeap::FillDebugBreak(buffer,uVar8);
      allocation->bytesUsed = allocation->bytesUsed + uVar8;
      local_3c = local_3c - uVar7;
      this->totalBytesAlignment = this->totalBytesAlignment + uVar8;
      dst = buffer + uVar8;
      local_70 = local_70 - uVar8;
      uVar8 = uVar6 - uVar8;
      if (uVar8 != 0) {
        if (local_3c == 0) goto LAB_003ede3e;
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *local_38 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/EmitBuffer.cpp"
                           ,0x20e,"(alignPad == 0)",
                           "If we are copying right now - we should be done with setting alignment."
                          );
        if (bVar3) {
          *local_38 = 0;
          goto LAB_003ede45;
        }
        goto LAB_003edf96;
      }
    }
    if (buffer + uVar6 != dst) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *local_38 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/EmitBuffer.cpp"
                         ,0x21c,"(readWriteBuffer + readWriteBytes == currentDestBuffer)",
                         "readWriteBuffer + readWriteBytes == currentDestBuffer");
      if (!bVar3) goto LAB_003edf96;
      *local_38 = 0;
    }
    BVar4 = Memory::CustomHeap::
            Heap<Memory::VirtualAllocWrapper,_Memory::PreReservedVirtualAllocWrapper>::
            ProtectAllocationWithExecuteReadOnly
                      ((Heap<Memory::VirtualAllocWrapper,_Memory::PreReservedVirtualAllocWrapper> *)
                       autoCs.cs,allocation->allocation,(char *)buffer);
    buffer = dst;
  } while (BVar4 != 0);
  bVar3 = false;
LAB_003edf79:
  AutoRealOrFakeCriticalSection<CriticalSection>::~AutoRealOrFakeCriticalSection(&local_90);
  return bVar3;
}

Assistant:

bool
EmitBufferManager<TAlloc, TPreReservedAlloc, SyncObject>::CommitBuffer(TEmitBufferAllocation* allocation, __in const size_t destBufferBytes, __out_bcount(destBufferBytes) BYTE* destBuffer, __in size_t bytes, __in_bcount(bytes) const BYTE* sourceBuffer, __in DWORD alignPad)
{
    AutoRealOrFakeCriticalSection<SyncObject> autoCs(&this->criticalSection);

    Assert(destBuffer != nullptr);
    Assert(allocation != nullptr);

    // The size of destBuffer is actually given by allocation->bytesCommitted, but due to a bug in some versions of PREFast, we can't refer to allocation->bytesCommitted in the
    // SAL annotation on destBuffer above.  We've informed the PREFast maintainers, but we'll have to use destBufferBytes as a workaround until their fix makes it to Jenkins.
    Assert(destBufferBytes == allocation->bytesCommitted);
    
    // Must have at least enough room in destBuffer for the initial skipped bytes plus the bytes we're going to write.
    AnalysisAssert(allocation->bytesUsed + bytes + alignPad <= destBufferBytes);

    BYTE *currentDestBuffer = destBuffer + allocation->GetBytesUsed();
    char *bufferToFlush = allocation->allocation->address + allocation->GetBytesUsed();
    Assert(allocation->BytesFree() >= bytes + alignPad);

    size_t bytesLeft = bytes + alignPad;
    size_t sizeToFlush = bytesLeft;

    // Copy the contents and set the alignment pad
    while(bytesLeft != 0)
    {
        // currentDestBuffer must still point to somewhere in the interior of destBuffer.
        AnalysisAssert(destBuffer <= currentDestBuffer);
        AnalysisAssert(currentDestBuffer < destBuffer + destBufferBytes);

        DWORD spaceInCurrentPage = AutoSystemInfo::PageSize - ((size_t)currentDestBuffer & (AutoSystemInfo::PageSize - 1));
        size_t bytesToChange = bytesLeft > spaceInCurrentPage ? spaceInCurrentPage : bytesLeft;


        // Buffer and the bytes that are marked RWX - these will eventually be marked as 'EXCEUTE' only.
        BYTE* readWriteBuffer = currentDestBuffer;
        size_t readWriteBytes = bytesToChange;

#ifdef ENABLE_DEBUG_CONFIG_OPTIONS
        if (CheckCommitFaultInjection())
        {
            return false;
        }
#endif
        if (!JITManager::GetJITManager()->IsJITServer() && !this->allocationHeap.ProtectAllocationWithExecuteReadWrite(allocation->allocation, (char*)readWriteBuffer))
        {
            return false;
        }

        // Pad with debug-breakpoint instructions up to alignBytes or the end of the current page, whichever is less.
        if (alignPad != 0)
        {
            DWORD alignBytes = alignPad < spaceInCurrentPage ? alignPad : spaceInCurrentPage;
            CustomHeap::FillDebugBreak(currentDestBuffer, alignBytes);

            alignPad -= alignBytes;
            currentDestBuffer += alignBytes;
            allocation->bytesUsed += alignBytes;
            bytesLeft -= alignBytes;
            bytesToChange -= alignBytes;

#if DBG_DUMP
            this->totalBytesAlignment += alignBytes;
#endif
        }

        // If there are bytes still left to be copied then we should do the copy, but only through the end of the current page.
        if(bytesToChange > 0)
        {
            AssertMsg(alignPad == 0, "If we are copying right now - we should be done with setting alignment.");

            const DWORD bufferBytesFree(allocation->BytesFree());
            // Use <= here instead of < to allow this memcopy to fill up the rest of destBuffer.  If we do, then FinalizeAllocation,
            // called below, determines that no additional padding is necessary based on the values in `allocation'.
            AnalysisAssert(currentDestBuffer + bufferBytesFree <= destBuffer + destBufferBytes);
            memcpy_s(currentDestBuffer, bufferBytesFree, sourceBuffer, bytesToChange);

            currentDestBuffer += bytesToChange;
            sourceBuffer += bytesToChange;
            allocation->bytesUsed += bytesToChange;
            bytesLeft -= bytesToChange;
        }

        Assert(readWriteBuffer + readWriteBytes == currentDestBuffer);

        if (!JITManager::GetJITManager()->IsJITServer() && !this->allocationHeap.ProtectAllocationWithExecuteReadOnly(allocation->allocation, (char*)readWriteBuffer))
        {
            return false;
        }
    }

    if (!FlushInstructionCache(this->processHandle, bufferToFlush, sizeToFlush))
    {
        return false;
    }

#if DBG_DUMP
    this->totalBytesCode += bytes;
#endif

    //Finish the current EmitBufferAllocation by filling out the rest of destBuffer with debug breakpoint instructions.
    return FinalizeAllocation(allocation, destBuffer);
}